

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::FString(FString *this,FString *head,FString *tail)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar1 = *(uint *)(head->Chars + -0xc);
  AllocBuffer(this,(ulong)*(uint *)(tail->Chars + -0xc) + (ulong)uVar1);
  pcVar2 = this->Chars;
  uVar3 = (ulong)*(uint *)(head->Chars + -0xc);
  memcpy(pcVar2,head->Chars,uVar3);
  pcVar2[uVar3] = '\0';
  pcVar2 = this->Chars;
  uVar3 = (ulong)*(uint *)(tail->Chars + -0xc);
  memcpy(pcVar2 + uVar1,tail->Chars,uVar3);
  (pcVar2 + uVar1)[uVar3] = '\0';
  return;
}

Assistant:

FString::FString (const FString &head, const FString &tail)
{
	size_t len1 = head.Len();
	size_t len2 = tail.Len();
	AllocBuffer (len1 + len2);
	StrCopy (Chars, head);
	StrCopy (Chars + len1, tail);
}